

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O0

int __thiscall
tchecker::typed_clock_to_clock_assign_statement_t::clone
          (typed_clock_to_clock_assign_statement_t *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  typed_lvalue_expression_t *ptVar1;
  typed_clock_to_clock_assign_statement_t *this_00;
  undefined1 local_30 [8];
  shared_ptr<const_tchecker::typed_lvalue_expression_t> rvalue_clone;
  shared_ptr<const_tchecker::typed_lvalue_expression_t> lvalue_clone;
  typed_clock_to_clock_assign_statement_t *this_local;
  
  ptVar1 = typed_assign_statement_t::lvalue(&this->super_typed_assign_statement_t);
  ptVar1 = (typed_lvalue_expression_t *)
           (**(code **)(*(long *)&ptVar1->super_typed_expression_t + 0x28))();
  std::shared_ptr<tchecker::typed_lvalue_expression_t_const>::
  shared_ptr<tchecker::typed_lvalue_expression_t,void>
            ((shared_ptr<tchecker::typed_lvalue_expression_t_const> *)
             &rvalue_clone.
              super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,ptVar1);
  ptVar1 = rclock(this);
  ptVar1 = (typed_lvalue_expression_t *)
           (**(code **)(*(long *)&ptVar1->super_typed_expression_t + 0x28))();
  std::shared_ptr<tchecker::typed_lvalue_expression_t_const>::
  shared_ptr<tchecker::typed_lvalue_expression_t,void>
            ((shared_ptr<tchecker::typed_lvalue_expression_t_const> *)local_30,ptVar1);
  this_00 = (typed_clock_to_clock_assign_statement_t *)operator_new(0x38);
  typed_clock_to_clock_assign_statement_t
            (this_00,(this->super_typed_assign_statement_t).super_typed_statement_t._type,
             (shared_ptr<const_tchecker::typed_lvalue_expression_t> *)
             &rvalue_clone.
              super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(shared_ptr<const_tchecker::typed_lvalue_expression_t> *)local_30);
  std::shared_ptr<const_tchecker::typed_lvalue_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_lvalue_expression_t> *)local_30);
  std::shared_ptr<const_tchecker::typed_lvalue_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_lvalue_expression_t> *)
             &rvalue_clone.
              super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return (int)this_00;
}

Assistant:

tchecker::typed_clock_to_clock_assign_statement_t * typed_clock_to_clock_assign_statement_t::clone() const
{
  std::shared_ptr<tchecker::typed_lvalue_expression_t const> lvalue_clone{lvalue().clone()};
  std::shared_ptr<tchecker::typed_lvalue_expression_t const> rvalue_clone{rclock().clone()};
  return new tchecker::typed_clock_to_clock_assign_statement_t{_type, lvalue_clone, rvalue_clone};
}